

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O2

void __thiscall
libebml::SafeReadIOCallback::Init(SafeReadIOCallback *this,IOCallback *IO,bool DeleteIO)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this->mIO = IO;
  this->mDeleteIO = DeleteIO;
  iVar1 = (*IO->_vptr_IOCallback[5])(IO);
  (*IO->_vptr_IOCallback[3])(IO,0,2);
  iVar2 = (*IO->_vptr_IOCallback[5])(IO);
  this->mSize = CONCAT44(extraout_var_00,iVar2);
  (*IO->_vptr_IOCallback[3])(IO,CONCAT44(extraout_var,iVar1),0);
  return;
}

Assistant:

void
SafeReadIOCallback::Init(IOCallback *IO,
                         bool DeleteIO) {
  mIO                = IO;
  mDeleteIO          = DeleteIO;
  int64 PrevPosition = IO->getFilePointer();
  IO->setFilePointer(0, seek_end);
  mSize              = IO->getFilePointer();
  IO->setFilePointer(PrevPosition);
}